

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_data_skip(archive_read *a)

{
  int64_t iVar1;
  long in_RDI;
  int ret;
  int64_t bytes_skipped;
  rar *rar;
  archive_entry *in_stack_00000020;
  archive_read *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  archive_read *in_stack_ffffffffffffffe0;
  archive_read *a_00;
  int local_4;
  
  a_00 = (archive_read *)**(long **)(in_RDI + 0x948);
  if (0 < a_00->read_data_offset) {
    __archive_read_consume
              (in_stack_ffffffffffffffe0,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    a_00->read_data_offset = 0;
  }
  if ((a_00->read_data_output_offset < 1) ||
     (iVar1 = __archive_read_consume
                        (in_stack_ffffffffffffffe0,
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)), -1 < iVar1)
     ) {
    if ((((a_00->archive).magic & 1) == 0) ||
       (((ulong)(a_00->archive).archive_format_name & 2) == 0)) {
      local_4 = 0;
    }
    else {
      local_4 = archive_read_format_rar_read_header(in_stack_00000028,in_stack_00000020);
      if (local_4 == 1) {
        local_4 = archive_read_format_rar_read_header(in_stack_00000028,in_stack_00000020);
      }
      if (local_4 == 0) {
        local_4 = archive_read_format_rar_read_data_skip(a_00);
      }
    }
  }
  else {
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_rar_read_data_skip(struct archive_read *a)
{
  struct rar *rar;
  int64_t bytes_skipped;
  int ret;

  rar = (struct rar *)(a->format->data);

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->bytes_remaining > 0) {
    bytes_skipped = __archive_read_consume(a, rar->bytes_remaining);
    if (bytes_skipped < 0)
      return (ARCHIVE_FATAL);
  }

  /* Compressed data to skip must be read from each header in a multivolume
   * archive.
   */
  if (rar->main_flags & MHD_VOLUME && rar->file_flags & FHD_SPLIT_AFTER)
  {
    ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret == (ARCHIVE_EOF))
      ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret != (ARCHIVE_OK))
      return ret;
    return archive_read_format_rar_read_data_skip(a);
  }

  return (ARCHIVE_OK);
}